

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

int template_enter(void *closure,char *name)

{
  long lVar1;
  int iVar2;
  tommy_count_t tVar3;
  size_t __n;
  long in_FS_OFFSET;
  exporter_state *state;
  char *name_local;
  void *closure_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = strlen(name);
  iVar2 = strncmp("roas",name,__n);
  if (iVar2 == 0) {
    *(undefined1 *)closure = 1;
    *(undefined4 *)((long)closure + 4) = 0;
    closure_local._4_4_ = 1;
  }
  else {
    if (*(int *)((long)closure + 4) != 0) {
      iVar2 = strcmp("last",name);
      if (iVar2 == 0) {
        iVar2 = *(int *)((long)closure + 4);
        tVar3 = tommy_array_size(*(tommy_array **)((long)closure + 8));
        if (iVar2 == tVar3 - 1) {
          closure_local._4_4_ = 1;
          goto LAB_001036fd;
        }
      }
    }
    closure_local._4_4_ = 0;
  }
LAB_001036fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return closure_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int template_enter(void *closure, const char *name)
{
	struct exporter_state *state = closure;

	if (strncmp("roas", name, strlen(name)) == 0) {
		state->roa_section = true;
		state->current_roa = 0;

		return 1;

	} else if (state->current_roa && strcmp("last", name) == 0 &&
		   state->current_roa == tommy_array_size(state->roas) - 1) {
		return 1;
	}

	return 0;
}